

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O1

void connection_unsubscribe_on_connection_close_received
               (ON_CONNECTION_CLOSED_EVENT_SUBSCRIPTION_HANDLE event_subscription)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (event_subscription == (ON_CONNECTION_CLOSED_EVENT_SUBSCRIPTION_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                 ,"connection_unsubscribe_on_connection_close_received",0x88e,1,
                 "NULL event_subscription");
      return;
    }
  }
  else {
    event_subscription->on_connection_close_received = (ON_CONNECTION_CLOSE_RECEIVED)0x0;
    event_subscription->context = (void *)0x0;
  }
  return;
}

Assistant:

void connection_unsubscribe_on_connection_close_received(ON_CONNECTION_CLOSED_EVENT_SUBSCRIPTION_HANDLE event_subscription)
{
    if (event_subscription == NULL)
    {
        LogError("NULL event_subscription");
    }
    else
    {
        /* Codes_S_R_S_CONNECTION_01_281: [ `connection_unsubscribe_on_connection_close_received` shall remove the subscription for the connection closed event that was made by calling `connection_subscribe_on_connection_close_received`. ]*/
        event_subscription->on_connection_close_received = NULL;
        event_subscription->context = NULL;
    }
}